

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O2

int splittingStep_AccessARKODEStepMem
              (void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKodeSplittingStepMem *step_mem)

{
  int iVar1;
  
  if (arkode_mem != (void *)0x0) {
    *ark_mem = (ARKodeMem)arkode_mem;
    iVar1 = splittingStep_AccessStepMem
                      ((ARKodeMem)arkode_mem,"splittingStep_AccessARKODEStepMem",step_mem);
    return iVar1;
  }
  arkProcessError((ARKodeMem)0x0,-0x15,0x33,fname,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                  ,"arkode_mem = NULL illegal.");
  return -0x15;
}

Assistant:

static int splittingStep_AccessARKODEStepMem(void* arkode_mem, const char* fname,
                                             ARKodeMem* ark_mem,
                                             ARKodeSplittingStepMem* step_mem)
{
  /* access ARKodeMem structure */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_ARK_NO_MEM);
    return ARK_MEM_NULL;
  }
  *ark_mem = (ARKodeMem)arkode_mem;

  return splittingStep_AccessStepMem(*ark_mem, __func__, step_mem);
}